

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O3

void __thiscall asl::CmdArgs::CmdArgs(CmdArgs *this,String *spec)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ulong in_RCX;
  long lVar4;
  long lVar5;
  int iVar6;
  Array<asl::String> a;
  File file;
  char buffer [256];
  Array<char> local_1d0;
  Array<asl::String> *local_1c8;
  Dic<asl::String> *local_1c0;
  String local_1b8;
  Dic<asl::Array<asl::String>_> *local_1a0;
  Array<asl::String> local_198;
  Array<asl::String> *local_190;
  String *local_188;
  File local_180;
  String local_138 [11];
  
  Array<asl::String>::alloc(&this->_args,0);
  Array<asl::String>::alloc(&this->_rest,0);
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)&this->_opts,0);
  Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::alloc
            ((Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal> *)&this->_multi,0);
  local_190 = &this->_unused;
  Array<asl::String>::alloc(local_190,0);
  String::String(local_138,"/proc/self/cmdline");
  File::File(&local_180,local_138,READ);
  if (local_138[0]._size != 0) {
    free((void *)local_138[0].field_2._0_8_);
  }
  if (local_180._file != (FILE *)0x0) {
    local_1c8 = &this->_rest;
    local_1c0 = &this->_opts;
    local_1a0 = &this->_multi;
    local_188 = spec;
    Array<char>::alloc(&local_1d0,0);
    do {
      uVar3 = File::read(&local_180,(int)local_138,(void *)0x100,in_RCX);
      iVar2 = (int)uVar3;
      if (iVar2 < 1) break;
      Array<char>::alloc((Array<char> *)&local_1b8,iVar2);
      in_RCX = 0;
      do {
        *(undefined1 *)(CONCAT44(local_1b8._len,local_1b8._size) + in_RCX) =
             *(undefined1 *)((long)&local_138[0]._size + in_RCX);
        in_RCX = in_RCX + 1;
      } while ((uVar3 & 0xffffffff) != in_RCX);
      Array<char>::append(&local_1d0,(Array<char> *)&local_1b8);
      LOCK();
      piVar1 = (int *)(CONCAT44(local_1b8._len,local_1b8._size) + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free((void *)(CONCAT44(local_1b8._len,local_1b8._size) + -0x10));
      }
    } while (0x100 < iVar2);
    if (*(int *)(local_1d0._a + -0x10) != 0) {
      Array<asl::String>::alloc(&local_198,0);
      iVar2 = *(int *)(local_1d0._a + -0x10);
      if (0 < iVar2) {
        iVar6 = 0;
        do {
          lVar4 = (long)iVar6;
          lVar5 = lVar4;
          while (iVar6 = iVar6 + 1, local_1d0._a[lVar5] != '\0') {
            lVar5 = lVar5 + 1;
            if (iVar6 == iVar2) goto LAB_0013c57f;
          }
          if (lVar5 == -1) break;
          String::String(&local_1b8,local_1d0._a + lVar4);
          Array<asl::String>::insert(&local_198,-1,&local_1b8);
          if (local_1b8._size != 0) {
            free(local_1b8.field_2._str);
          }
          iVar2 = *(int *)(local_1d0._a + -0x10);
        } while (iVar6 < iVar2);
      }
LAB_0013c57f:
      iVar2 = *(int *)&local_198._a[-1].field_2;
      Array<asl::String>::with<char_const*>((Array<asl::String> *)&local_1b8);
      parse(this,iVar2,(char **)CONCAT44(local_1b8._len,local_1b8._size),local_188);
      LOCK();
      piVar1 = (int *)(CONCAT44(local_1b8._len,local_1b8._size) + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free((void *)(CONCAT44(local_1b8._len,local_1b8._size) + -0x10));
      }
      Array<asl::String>::~Array(&local_198);
    }
    LOCK();
    piVar1 = (int *)(local_1d0._a + -8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(local_1d0._a + -0x10);
    }
  }
  File::~File(&local_180);
  return;
}

Assistant:

CmdArgs::CmdArgs(const String& spec)
{
#ifdef _WIN32
	int nArgs = 0;
	LPWSTR* wargs = CommandLineToArgvW(GetCommandLineW(), &nArgs);
	if (wargs == NULL)
		return;
	Array<String> a;
	for (int i = 0; i < nArgs; i++)
		a << wargs[i];

	LocalFree(wargs);
	parse(-nArgs, (char**)(a.with<const char*>()).data(), spec);
#else
	File file("/proc/self/cmdline", File::READ);
	if (!file)
		return;
	char buffer[256];
	Array<char> all;
	int n;
	while ((n = file.read(buffer, sizeof(buffer))) > 0)
	{
		all.append(Array<char>((char*)buffer, n));
		if (n <= (int)sizeof(buffer))
			break;
	}
	if (all.length() == 0)
		return;
	int i = 0, j = 0;
	Array<String> a;
	while ((j = all.indexOf('\0', i)) != -1)
	{
		a << String(&all[i]);
		i = j + 1;
	}

	parse(a.length(), (char**)(a.with<const char*>()).data(), spec);
#endif
}